

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall Nova::Driver<float,_3>::Read_Last_Frame(Driver<float,_3> *this)

{
  bool bVar1;
  string filename;
  
  std::operator+(&filename,&this->example->output_directory,"/common/last_frame");
  bVar1 = File_Utilities::File_Exists(&filename,true);
  if (bVar1) {
    File_Utilities::Read_From_Text_File<int>(&filename,&this->example->restart_frame);
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void Driver<T,d>::
Read_Last_Frame()
{
    std::string filename=example.output_directory+"/common/last_frame";
    if(File_Utilities::File_Exists(filename))
        File_Utilities::Read_From_Text_File(filename,example.restart_frame);
}